

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::atomic_precision
               (NegativeTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "It is an error to declare an atomic type with a lowp or mediump precision.",&local_31)
  ;
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  iterateShaders(ctx,TESTCASE_LAYOUT_MEDIUMP_PRECISION);
  iterateShaders(ctx,TESTCASE_LAYOUT_LOWP_PRECISION);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void atomic_precision (NegativeTestContext& ctx)
{
	ctx.beginSection("It is an error to declare an atomic type with a lowp or mediump precision.");
	iterateShaders(ctx, TESTCASE_LAYOUT_MEDIUMP_PRECISION);
	iterateShaders(ctx, TESTCASE_LAYOUT_LOWP_PRECISION);
	ctx.endSection();
}